

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::propagateError(CoreBroker *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  CoreBroker *this_00;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  string_view sVar3;
  bool in_stack_000000bb;
  int in_stack_000000bc;
  BrokerBase *in_stack_000000c0;
  undefined1 in_stack_000000c8 [16];
  GlobalFederateId in_stack_000000dc;
  int in_stack_00000194;
  BrokerBase *in_stack_00000198;
  undefined1 in_stack_000001a0 [16];
  string_view in_stack_00000200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  ActionMessage *cmd_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  CoreBroker *this_02;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ActionMessage *cmd_01;
  GlobalFederateId local_3c;
  string_view local_38;
  __sv_type local_28;
  BaseType local_18;
  GlobalFederateId local_14;
  ActionMessage *local_10;
  
  cmd_01 = (ActionMessage *)&in_RDI->super_BrokerBase;
  local_18 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  local_10 = in_RSI;
  GlobalFederateId::GlobalFederateId(&local_14,(GlobalBrokerId)local_18);
  getIdentifier_abi_cxx11_(in_RDI);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff60);
  local_38 = SmallBuffer::to_string((SmallBuffer *)0x5e3081);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38._M_str;
  BrokerBase::sendToLogger
            (in_stack_000000c0,in_stack_000000dc,in_stack_000000bc,(string_view)in_stack_000000c8,
             in_stack_00000200,in_stack_000000bb);
  aVar2 = ActionMessage::action(local_10);
  if ((aVar2 == cmd_local_error) && (((in_RDI->super_BrokerBase).terminate_on_error & 1U) != 0)) {
    cmd_00 = (ActionMessage *)&in_RDI->super_BrokerBase;
    GlobalFederateId::GlobalFederateId
              (&local_3c,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    getIdentifier_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff70,(char *)cmd_00);
    BrokerBase::sendToLogger
              (in_stack_000000c0,in_stack_000000dc,in_stack_000000bc,(string_view)in_stack_000000c8,
               in_stack_00000200,in_stack_000000bb);
    ActionMessage::setAction(local_10,cmd_global_error);
    this_02 = (CoreBroker *)&in_RDI->super_BrokerBase;
    sVar3 = SmallBuffer::to_string((SmallBuffer *)0x5e31b7);
    this_00 = (CoreBroker *)sVar3._M_len;
    BrokerBase::setErrorState(in_stack_00000198,in_stack_00000194,(string_view)in_stack_000001a0);
    broadcast(this_00,cmd_01);
    bVar1 = isRoot((CoreBroker *)0x5e31f5);
    if (!bVar1) {
      transmitToParent(this_02,cmd_00);
    }
  }
  else {
    routeMessage(in_RDI,(ActionMessage *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  return;
}

Assistant:

void CoreBroker::propagateError(ActionMessage&& cmd)
{
    LOG_ERROR(global_broker_id_local, getIdentifier(), cmd.payload.to_string());
    if (cmd.action() == CMD_LOCAL_ERROR) {
        if (terminate_on_error) {
            LOG_ERROR(global_broker_id_local,
                      getIdentifier(),
                      "Error Escalation: Federation terminating");
            cmd.setAction(CMD_GLOBAL_ERROR);
            setErrorState(cmd.messageID, cmd.payload.to_string());
            broadcast(cmd);
            if (!isRoot()) {
                transmitToParent(std::move(cmd));
            } else {
            }
            return;
        }
    }
    routeMessage(std::move(cmd));
}